

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceIndex
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint32_t type;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TypeManager *this;
  ConstantManager *this_00;
  FeatureManager *pFVar4;
  Instruction *pIVar5;
  Instruction *pIVar6;
  Instruction *this_01;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_12c;
  Instruction *local_128;
  Instruction *local_120;
  Instruction *local_118;
  Instruction *local_110;
  Instruction *local_108;
  Instruction *local_100;
  uint32_t local_f8;
  uint32_t local_f4;
  uint32_t local_f0;
  uint32_t local_ec;
  uint32_t local_e8;
  uint32_t local_e4;
  SmallVector<unsigned_int,_2UL> local_e0;
  Instruction *local_b8;
  Instruction *local_b0;
  undefined1 local_a8 [48];
  Instruction *local_78;
  IRContext *local_70;
  InstructionBuilder ir_builder;
  OperandList new_operands;
  
  this = IRContext::get_type_mgr(ctx);
  this_00 = IRContext::get_constant_mgr(ctx);
  type = analysis::TypeManager::GetFloatTypeId(this);
  local_e4 = analysis::TypeManager::GetBoolTypeId(this);
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  local_b0 = inst;
  uVar1 = Instruction::GetSingleWordInOperand(inst,2);
  pFVar4 = IRContext::get_feature_mgr(ctx);
  uVar2 = pFVar4->extinst_importid_GLSLstd450_;
  if (uVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"GLSL.std.450",(allocator<char> *)&local_e0);
    IRContext::AddExtInstImport(ctx,(string *)local_a8);
    std::__cxx11::string::_M_dispose();
    pFVar4 = IRContext::get_feature_mgr(ctx);
    uVar2 = pFVar4->extinst_importid_GLSLstd450_;
  }
  local_128 = (Instruction *)CONCAT44(local_128._4_4_,uVar2);
  uVar2 = analysis::ConstantManager::GetFloatConstId(this_00,0.0);
  local_120 = (Instruction *)CONCAT44(local_120._4_4_,uVar2);
  local_e8 = analysis::ConstantManager::GetFloatConstId(this_00,1.0);
  local_ec = analysis::ConstantManager::GetFloatConstId(this_00,2.0);
  local_f0 = analysis::ConstantManager::GetFloatConstId(this_00,3.0);
  local_f4 = analysis::ConstantManager::GetFloatConstId(this_00,4.0);
  local_f8 = analysis::ConstantManager::GetFloatConstId(this_00,5.0);
  local_e0._vptr_SmallVector._0_4_ = 0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0);
  local_70 = ctx;
  pIVar5 = InstructionBuilder::AddCompositeExtract
                     (&ir_builder,type,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_100 = pIVar5;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_e0._vptr_SmallVector._0_4_ = 1;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,
             (undefined1 *)((long)&local_e0._vptr_SmallVector + 4));
  pIVar6 = InstructionBuilder::AddCompositeExtract
                     (&ir_builder,type,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_110 = pIVar6;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_e0._vptr_SmallVector._0_4_ = 2;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,
             (undefined1 *)((long)&local_e0._vptr_SmallVector + 4));
  local_108 = InstructionBuilder::AddCompositeExtract
                        (&ir_builder,type,uVar1,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_e0._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar5);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,
             (undefined1 *)((long)&local_e0._vptr_SmallVector + 4));
  uVar2 = (uint32_t)local_128;
  local_b8 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,type,(uint32_t)local_128,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_e0._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar6);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,
             (undefined1 *)((long)&local_e0._vptr_SmallVector + 4));
  local_78 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,type,uVar2,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  pIVar5 = local_108;
  local_e0._vptr_SmallVector._0_4_ = Instruction::result_id(local_108);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,
             (undefined1 *)((long)&local_e0._vptr_SmallVector + 4));
  local_118 = InstructionBuilder::AddNaryExtendedInstruction
                        (&ir_builder,type,uVar2,4,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  uVar3 = Instruction::result_id(pIVar5);
  uVar1 = local_e4;
  uVar2 = (uint32_t)local_120;
  local_108 = InstructionBuilder::AddBinaryOp
                        (&ir_builder,local_e4,OpFOrdLessThan,uVar3,(uint32_t)local_120);
  uVar3 = Instruction::result_id(local_110);
  local_110 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdLessThan,uVar3,uVar2);
  uVar3 = Instruction::result_id(local_100);
  local_100 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdLessThan,uVar3,uVar2);
  local_e0._vptr_SmallVector._0_4_ = Instruction::result_id(local_b8);
  pIVar5 = local_78;
  local_e0._vptr_SmallVector._4_4_ = Instruction::result_id(local_78);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (_func_int **)0x0;
  local_a8._16_8_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_a8,&local_e0,&local_e0.size_
            );
  pIVar6 = InstructionBuilder::AddNaryExtendedInstruction
                     (&ir_builder,type,(uint32_t)local_128,0x28,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  uVar2 = Instruction::result_id(local_118);
  uVar3 = Instruction::result_id(pIVar6);
  local_118 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdGreaterThanEqual,uVar2,uVar3);
  uVar2 = Instruction::result_id(pIVar5);
  uVar3 = Instruction::result_id(local_b8);
  pIVar5 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpFOrdGreaterThanEqual,uVar2,uVar3);
  uVar2 = Instruction::result_id(local_108);
  local_128 = InstructionBuilder::AddSelect(&ir_builder,type,uVar2,local_f8,local_f4);
  uVar2 = Instruction::result_id(local_110);
  pIVar6 = InstructionBuilder::AddSelect(&ir_builder,type,uVar2,local_f0,local_ec);
  uVar2 = Instruction::result_id(local_100);
  this_01 = InstructionBuilder::AddSelect(&ir_builder,type,uVar2,local_e8,(uint32_t)local_120);
  uVar2 = Instruction::result_id(pIVar5);
  uVar1 = Instruction::result_id(pIVar6);
  uVar3 = Instruction::result_id(this_01);
  local_120 = InstructionBuilder::AddSelect(&ir_builder,type,uVar2,uVar1,uVar3);
  local_b0->opcode_ = OpSelect;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12c = Instruction::result_id(local_118);
  init_list._M_len = 1;
  init_list._M_array = &local_12c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
  local_a8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_12c = Instruction::result_id(local_128);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_12c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
  local_a8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_12c = Instruction::result_id(local_120);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_12c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_01);
  local_a8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  pIVar5 = local_b0;
  Instruction::SetInOperands(local_b0,&new_operands);
  IRContext::UpdateDefUse(local_70,pIVar5);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            (&new_operands);
  return true;
}

Assistant:

bool ReplaceCubeFaceIndex(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f1_const_id = const_mgr->GetFloatConstId(1.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f3_const_id = const_mgr->GetFloatConstId(3.0);
  uint32_t f4_const_id = const_mgr->GetFloatConstId(4.0);
  uint32_t f5_const_id = const_mgr->GetFloatConstId(5.0);

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Get the absolute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Find the max value.
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());

  // Get the value for each case.
  Instruction* case_z = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), f5_const_id, f4_const_id);
  Instruction* case_y = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), f3_const_id, f2_const_id);
  Instruction* case_x = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), f1_const_id, f0_const_id);

  // Select the correct case.
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, y_gr_x->result_id(),
                           case_y->result_id(), case_x->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_z_max->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {case_z->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {sel->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}